

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

void __thiscall
flow_cutter::AssimilatedNodeSet::
shrink_cut_front<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
          (AssimilatedNodeSet *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph)

{
  anon_class_16_2_f7da023b_for__M_pred __pred;
  iterator __first;
  iterator __last;
  const_iterator in_RSI;
  AssimilatedNodeSet *in_RDI;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  const_iterator __last_00;
  
  this_00 = &in_RDI->front;
  __first = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)in_RDI);
  __last = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
  __pred.graph = (Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
                  *)in_RSI._M_current;
  __pred.this = in_RDI;
  __last_00._M_current = (int *)in_RDI;
  std::
  remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,flow_cutter::AssimilatedNodeSet::shrink_cut_front<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>(flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>const&)::_lambda(int)_1_>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             __pred);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::erase(in_stack_ffffffffffffffb8,in_RSI,__last_00);
  return;
}

Assistant:

void shrink_cut_front(const Graph& graph)
    {
        front.erase(std::remove_if(
                        front.begin(), front.end(),
                        [&](int xy) { return node_set.is_inside(graph.head(xy)); }),
            front.end());
    }